

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerViewer.cpp
# Opt level: O0

void __thiscall
PathTracerViewer::create_main_graphics_pipeline
          (PathTracerViewer *this,shared_ptr<myvk::RenderPass> *render_pass,uint32_t subpass)

{
  initializer_list<std::shared_ptr<myvk::DescriptorSetLayout>_> __l;
  initializer_list<VkPipelineShaderStageCreateInfo> __l_00;
  initializer_list<VkVertexInputBindingDescription> __l_01;
  initializer_list<VkVertexInputAttributeDescription> __l_02;
  initializer_list<VkDynamicState> __l_03;
  element_type *peVar1;
  GraphicsPipelineState pipeline_state;
  VkVertexInputAttributeDescription attribute_description;
  VkVertexInputBindingDescription binding_descriptor;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  shader_stages;
  shared_ptr<myvk::ShaderModule> frag_shader_module;
  shared_ptr<myvk::ShaderModule> vert_shader_module;
  uint32_t kPathTracerViewerMainFragSpirv [145];
  uint32_t kPathTracerViewerMainVertSpirv [246];
  shared_ptr<myvk::Device> device;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> *in_stack_fffffffffffff418;
  GraphicsPipelineState *in_stack_fffffffffffff420;
  vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  *in_stack_fffffffffffff428;
  VertexInputState *in_stack_fffffffffffff430;
  undefined8 in_stack_fffffffffffff438;
  VkShaderStageFlagBits stage;
  ShaderModule *in_stack_fffffffffffff440;
  allocator_type *in_stack_fffffffffffff448;
  allocator_type *__a;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  *in_stack_fffffffffffff450;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> *this_00;
  iterator in_stack_fffffffffffff458;
  pointer pVVar2;
  size_type in_stack_fffffffffffff460;
  pointer pVVar3;
  undefined1 *puVar4;
  ColorBlendState *this_01;
  uint32_t code_size;
  Ptr<Device> *device_00;
  Ptr<Device> *local_b50;
  allocator<VkDynamicState> local_b11;
  undefined4 local_b10;
  undefined4 local_b0c;
  vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *in_stack_fffffffffffff4f8;
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  *in_stack_fffffffffffff500;
  Ptr<Device> *in_stack_fffffffffffff508;
  allocator_type local_ad9;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 *local_ac8;
  undefined8 local_ac0;
  uint32_t in_stack_fffffffffffff54c;
  GraphicsPipelineState *in_stack_fffffffffffff550;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  *in_stack_fffffffffffff558;
  Ptr<RenderPass> *in_stack_fffffffffffff560;
  Ptr<PipelineLayout> *pipeline_layout;
  RasterizationState local_a60;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> local_a20;
  pointer local_a08;
  pointer pVStack_a00;
  undefined8 local_9f8;
  undefined4 local_9f0;
  undefined8 local_9e8;
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined8 local_9d8;
  undefined4 local_9d0;
  undefined8 local_9c8;
  undefined1 local_9c0;
  InputAssemblyState local_9b8;
  undefined4 local_990;
  undefined8 local_988;
  undefined4 local_980;
  undefined4 local_97c;
  undefined1 local_978;
  ViewportState local_970;
  MultisampleState local_908;
  undefined4 local_8d0;
  undefined8 local_8c8;
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  pointer pVStack_8a8;
  undefined4 uStack_8a0;
  undefined4 local_89c;
  undefined4 uStack_898;
  pointer pVStack_894;
  pointer pVStack_88c;
  undefined4 uStack_884;
  undefined4 local_880;
  undefined4 uStack_87c;
  pointer pVStack_878;
  undefined4 local_870;
  undefined4 local_86c;
  undefined1 local_868;
  pointer local_860;
  pointer pVStack_858;
  undefined8 local_850;
  undefined4 local_848;
  undefined8 local_840;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined8 local_828;
  pointer local_820;
  pointer pVStack_818;
  undefined1 local_810;
  pointer local_808;
  pointer pVStack_800;
  undefined8 local_7f8;
  undefined4 local_7f0;
  undefined8 local_7e8;
  undefined4 local_7e0;
  undefined4 local_7dc;
  undefined8 local_7d8;
  undefined1 local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  Ptr<PipelineLayout> *local_7b0;
  undefined4 local_7a8;
  allocator<VkPipelineShaderStageCreateInfo> local_7a1;
  undefined1 local_7a0 [96];
  undefined1 *local_740;
  undefined8 local_738;
  undefined1 local_718 [16];
  ColorBlendState local_708 [7];
  undefined1 local_488 [992];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  allocator<std::shared_ptr<myvk::DescriptorSetLayout>_> local_71;
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  
  peVar1 = std::__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x17585b);
  (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  std::shared_ptr<myvk::Device>::shared_ptr
            ((shared_ptr<myvk::Device> *)in_stack_fffffffffffff420,
             (shared_ptr<myvk::Device> *)in_stack_fffffffffffff418);
  std::shared_ptr<myvk::DescriptorSetLayout>::shared_ptr
            ((shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffff420,
             (shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffff418);
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_60 = (element_type *)&stack0xffffffffffffff90;
  std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>::allocator
            ((allocator<std::shared_ptr<myvk::DescriptorSetLayout>_> *)0x1758cc);
  __l._M_len = in_stack_fffffffffffff460;
  __l._M_array = (iterator)in_stack_fffffffffffff458;
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
            *)in_stack_fffffffffffff450,__l,(allocator_type *)in_stack_fffffffffffff448);
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  std::vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::vector
            ((vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)0x17591f);
  myvk::PipelineLayout::Create
            (in_stack_fffffffffffff508,in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
  std::shared_ptr<myvk::PipelineLayout>::operator=
            ((shared_ptr<myvk::PipelineLayout> *)in_stack_fffffffffffff420,
             (shared_ptr<myvk::PipelineLayout> *)in_stack_fffffffffffff418);
  std::shared_ptr<myvk::PipelineLayout>::~shared_ptr((shared_ptr<myvk::PipelineLayout> *)0x17596f);
  std::vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_>::~vector
            ((vector<VkPushConstantRange,_std::allocator<VkPushConstantRange>_> *)
             in_stack_fffffffffffff430);
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
             *)in_stack_fffffffffffff430);
  std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>::~allocator(&local_71);
  device_00 = (Ptr<Device> *)&stack0xffffffffffffff90;
  local_b50 = (Ptr<Device> *)&stack0xffffffffffffffa0;
  do {
    local_b50 = local_b50 + -1;
    std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
              ((shared_ptr<myvk::DescriptorSetLayout> *)0x1759cb);
    stage = (VkShaderStageFlagBits)((ulong)in_stack_fffffffffffff438 >> 0x20);
  } while (local_b50 != device_00);
  puVar4 = local_488;
  memcpy(puVar4,&DAT_00406250,0x3d8);
  code_size = (uint32_t)((ulong)puVar4 >> 0x20);
  memcpy(&local_708[0].m_create_info.logicOp,&DAT_00406630,0x244);
  std::shared_ptr<myvk::ShaderModule>::shared_ptr((shared_ptr<myvk::ShaderModule> *)0x175a2f);
  std::shared_ptr<myvk::ShaderModule>::shared_ptr((shared_ptr<myvk::ShaderModule> *)0x175a3c);
  myvk::ShaderModule::Create(device_00,(uint32_t *)local_b50,code_size);
  this_01 = local_708;
  std::shared_ptr<myvk::ShaderModule>::operator=
            ((shared_ptr<myvk::ShaderModule> *)in_stack_fffffffffffff420,
             (shared_ptr<myvk::ShaderModule> *)in_stack_fffffffffffff418);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x175a84);
  myvk::ShaderModule::Create(device_00,(uint32_t *)local_b50,code_size);
  puVar4 = local_718;
  std::shared_ptr<myvk::ShaderModule>::operator=
            ((shared_ptr<myvk::ShaderModule> *)in_stack_fffffffffffff420,
             (shared_ptr<myvk::ShaderModule> *)in_stack_fffffffffffff418);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x175acc);
  std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x175ad9);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            (in_stack_fffffffffffff440,stage,(VkSpecializationInfo *)in_stack_fffffffffffff430);
  std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x175b0e);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            (in_stack_fffffffffffff440,stage,(VkSpecializationInfo *)in_stack_fffffffffffff430);
  local_740 = local_7a0;
  local_738 = 2;
  std::allocator<VkPipelineShaderStageCreateInfo>::allocator
            ((allocator<VkPipelineShaderStageCreateInfo> *)0x175b54);
  __l_00._M_len = in_stack_fffffffffffff460;
  __l_00._M_array = in_stack_fffffffffffff458;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector(in_stack_fffffffffffff450,__l_00,(allocator_type *)in_stack_fffffffffffff448);
  std::allocator<VkPipelineShaderStageCreateInfo>::~allocator(&local_7a1);
  local_7b0 = (Ptr<PipelineLayout> *)0x800000000;
  local_7a8 = 0;
  pVVar2 = (pointer)0x0;
  pVVar3 = (pointer)0x0;
  local_7c8 = 0;
  uStack_7c0 = 0x67;
  local_a60.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_a60.m_create_info.pNext = (void *)0x0;
  local_a60.m_create_info.flags = 0;
  local_a60.m_create_info.depthClampEnable = 0;
  local_a60.m_create_info.rasterizerDiscardEnable = 0;
  local_a60.m_create_info.polygonMode = VK_POLYGON_MODE_FILL;
  local_a60.m_create_info.cullMode = 0;
  local_a60.m_create_info.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  local_a60.m_create_info.depthBiasEnable = 0;
  local_a60.m_create_info.depthBiasConstantFactor = 0.0;
  local_a60.m_create_info.depthBiasClamp = 0.0;
  local_a60.m_create_info.depthBiasSlopeFactor = 0.0;
  local_a60.m_create_info.lineWidth = 0.0;
  this_00 = &local_a20;
  local_a20.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a20.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a20.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>::
  vector((vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
          *)0x175caf);
  local_9f8 = 0;
  local_a08 = pVVar2;
  pVStack_a00 = pVVar3;
  std::vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ::vector((vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
            *)0x175cd5);
  local_9f0 = 0x13;
  local_9e8 = 0;
  local_9e0 = 0;
  local_9dc = 0;
  local_9d8 = 0;
  local_9d0 = 0;
  local_9c8 = 0;
  local_9c0 = 0;
  local_9b8.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_9b8.m_create_info.pNext = (void *)0x0;
  local_9b8.m_create_info.flags = 0;
  local_9b8.m_create_info.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_9b8.m_create_info.primitiveRestartEnable = 0;
  local_9b8.m_enable = false;
  local_990 = 0x15;
  local_988 = 0;
  local_980 = 0;
  local_97c = 0;
  local_978 = 0;
  local_970.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_970.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = pVVar2;
  local_970.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = pVVar3;
  std::vector<VkViewport,_std::allocator<VkViewport>_>::vector
            ((vector<VkViewport,_std::allocator<VkViewport>_> *)0x175dc8);
  local_970.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_970.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pVVar2;
  local_970.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pVVar3;
  std::vector<VkRect2D,_std::allocator<VkRect2D>_>::vector
            ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)0x175dee);
  local_970.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_970.m_create_info.pNext = (void *)0x0;
  local_970.m_create_info.flags = 0;
  local_970.m_create_info.viewportCount = 0;
  local_970.m_create_info.pViewports = (VkViewport *)0x0;
  local_970.m_create_info.scissorCount = 0;
  local_970.m_create_info.pScissors = (VkRect2D *)0x0;
  local_970.m_enable = false;
  local_908.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_908.m_create_info.pNext = (void *)0x0;
  local_908.m_create_info.flags = 0;
  local_908.m_create_info.rasterizationSamples = 0;
  local_908.m_create_info.sampleShadingEnable = 0;
  local_908.m_create_info.minSampleShading = 0.0;
  local_908.m_create_info.pSampleMask = (VkSampleMask *)0x0;
  local_908.m_create_info.alphaToCoverageEnable = 0;
  local_908.m_create_info.alphaToOneEnable = 0;
  local_908.m_enable = false;
  local_8d0 = 0x19;
  local_8c8 = 0;
  local_8c0 = 0;
  local_8bc = 0;
  local_8b8 = 0;
  local_8b4 = 0;
  local_8b0 = 0;
  local_8ac = 0;
  uStack_898 = (undefined4)((ulong)pVVar2 >> 0x20);
  uStack_8a0 = SUB84(pVVar3,0);
  local_89c = (undefined4)((ulong)pVVar3 >> 0x20);
  local_870 = 0;
  local_86c = 0;
  local_868 = 0;
  local_850 = 0;
  pVStack_8a8 = pVVar2;
  pVStack_894 = pVVar3;
  pVStack_88c = pVVar2;
  uStack_884 = uStack_8a0;
  local_880 = local_89c;
  uStack_87c = uStack_898;
  pVStack_878 = pVVar3;
  local_860 = pVVar2;
  pVStack_858 = pVVar3;
  std::
  vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ::vector((vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
            *)0x175f70);
  local_848 = 0x1a;
  local_840 = 0;
  local_838 = 0;
  local_834 = 0;
  local_830 = 0;
  local_82c = 0;
  local_828 = 0;
  local_810 = 0;
  local_7f8 = 0;
  local_820 = pVVar2;
  pVStack_818 = pVVar3;
  local_808 = pVVar2;
  pVStack_800 = pVVar3;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)0x175ff5);
  local_7f0 = 0x1b;
  local_7e8 = 0;
  local_7e0 = 0;
  local_7dc = 0;
  local_7d8 = 0;
  local_7d0 = 0;
  pipeline_layout = local_7b0;
  std::allocator<VkVertexInputBindingDescription>::allocator
            ((allocator<VkVertexInputBindingDescription> *)0x176082);
  __l_01._M_len = (size_type)pVVar3;
  __l_01._M_array = (iterator)pVVar2;
  std::vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>::
  vector((vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
          *)this_00,__l_01,in_stack_fffffffffffff448);
  local_ad8 = local_7c8;
  uStack_ad0 = uStack_7c0;
  local_ac8 = &local_ad8;
  local_ac0 = 1;
  __a = &local_ad9;
  std::allocator<VkVertexInputAttributeDescription>::allocator
            ((allocator<VkVertexInputAttributeDescription> *)0x1760e4);
  __l_02._M_len = (size_type)pVVar3;
  __l_02._M_array = (iterator)pVVar2;
  std::vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ::vector((vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
            *)this_00,__l_02,__a);
  myvk::GraphicsPipelineState::VertexInputState::Enable
            (in_stack_fffffffffffff430,in_stack_fffffffffffff428,
             (vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
              *)in_stack_fffffffffffff420);
  std::vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ::~vector((vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
             *)in_stack_fffffffffffff430);
  std::allocator<VkVertexInputAttributeDescription>::~allocator(&local_ad9);
  std::vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>::
  ~vector(&in_stack_fffffffffffff430->m_bindings);
  std::allocator<VkVertexInputBindingDescription>::~allocator
            ((allocator<VkVertexInputBindingDescription> *)&stack0xfffffffffffff567);
  myvk::GraphicsPipelineState::InputAssemblyState::Enable
            (&local_9b8,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0);
  myvk::GraphicsPipelineState::ViewportState::Enable(&local_970,1,1);
  myvk::GraphicsPipelineState::RasterizationState::Initialize
            (&local_a60,VK_POLYGON_MODE_FILL,VK_FRONT_FACE_COUNTER_CLOCKWISE,1);
  myvk::GraphicsPipelineState::MultisampleState::Enable(&local_908,VK_SAMPLE_COUNT_1_BIT);
  myvk::GraphicsPipelineState::ColorBlendState::Enable
            (this_01,(uint32_t)((ulong)puVar4 >> 0x20),(VkBool32)puVar4);
  local_b10 = 0;
  local_b0c = 1;
  std::allocator<VkDynamicState>::allocator((allocator<VkDynamicState> *)0x176217);
  __l_03._M_len = (size_type)pVVar3;
  __l_03._M_array = (iterator)pVVar2;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            (this_00,__l_03,(allocator_type *)__a);
  myvk::GraphicsPipelineState::DynamicState::Enable
            ((DynamicState *)in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::~vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)in_stack_fffffffffffff430);
  std::allocator<VkDynamicState>::~allocator(&local_b11);
  myvk::GraphicsPipeline::Create
            (pipeline_layout,in_stack_fffffffffffff560,in_stack_fffffffffffff558,
             in_stack_fffffffffffff550,in_stack_fffffffffffff54c);
  std::shared_ptr<myvk::GraphicsPipeline>::operator=
            ((shared_ptr<myvk::GraphicsPipeline> *)in_stack_fffffffffffff420,
             (shared_ptr<myvk::GraphicsPipeline> *)in_stack_fffffffffffff418);
  std::shared_ptr<myvk::GraphicsPipeline>::~shared_ptr
            ((shared_ptr<myvk::GraphicsPipeline> *)0x1762d0);
  myvk::GraphicsPipelineState::~GraphicsPipelineState(in_stack_fffffffffffff420);
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  ~vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           *)in_stack_fffffffffffff430);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x1762f7);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x176304);
  std::shared_ptr<myvk::Device>::~shared_ptr((shared_ptr<myvk::Device> *)0x176311);
  return;
}

Assistant:

void PathTracerViewer::create_main_graphics_pipeline(const std::shared_ptr<myvk::RenderPass> &render_pass,
                                                     uint32_t subpass) {
	std::shared_ptr<myvk::Device> device = render_pass->GetDevicePtr();

	m_main_pipeline_layout = myvk::PipelineLayout::Create(device, {m_descriptor_set_layout}, {});

	constexpr uint32_t kPathTracerViewerMainVertSpirv[] = {
#include "spirv/path_tracer_viewer_main.vert.u32"
	};
	constexpr uint32_t kPathTracerViewerMainFragSpirv[] = {
#include "spirv/path_tracer_viewer_main.frag.u32"
	};

	std::shared_ptr<myvk::ShaderModule> vert_shader_module, frag_shader_module;
	vert_shader_module =
	    myvk::ShaderModule::Create(device, kPathTracerViewerMainVertSpirv, sizeof(kPathTracerViewerMainVertSpirv));
	frag_shader_module =
	    myvk::ShaderModule::Create(device, kPathTracerViewerMainFragSpirv, sizeof(kPathTracerViewerMainFragSpirv));

	std::vector<VkPipelineShaderStageCreateInfo> shader_stages = {
	    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
	    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

	VkVertexInputBindingDescription binding_descriptor = {};
	binding_descriptor.binding = 0;
	binding_descriptor.stride = sizeof(float) * 2;
	binding_descriptor.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;

	VkVertexInputAttributeDescription attribute_description = {};
	attribute_description.binding = 0;
	attribute_description.location = 0;
	attribute_description.format = VK_FORMAT_R32G32_SFLOAT;
	attribute_description.offset = 0;

	myvk::GraphicsPipelineState pipeline_state = {};
	pipeline_state.m_vertex_input_state.Enable({binding_descriptor}, {attribute_description});
	pipeline_state.m_input_assembly_state.Enable(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	pipeline_state.m_viewport_state.Enable(1, 1);
	pipeline_state.m_rasterization_state.Initialize(VK_POLYGON_MODE_FILL, VK_FRONT_FACE_COUNTER_CLOCKWISE,
	                                                VK_CULL_MODE_FRONT_BIT);
	pipeline_state.m_multisample_state.Enable(VK_SAMPLE_COUNT_1_BIT);
	pipeline_state.m_color_blend_state.Enable(1, VK_FALSE);
	pipeline_state.m_dynamic_state.Enable({VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR});

	m_main_graphics_pipeline =
	    myvk::GraphicsPipeline::Create(m_main_pipeline_layout, render_pass, shader_stages, pipeline_state, subpass);
}